

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_body(LexState *ls,ExpDesc *e,int needself,BCLine line)

{
  undefined8 fs_00;
  BCReg BVar1;
  BCPos BVar2;
  long lVar3;
  GCobj *gc;
  ptrdiff_t oldbase;
  GCproto *pt;
  FuncScope bl;
  FuncState *pfs;
  FuncState fs;
  BCLine line_local;
  int needself_local;
  ExpDesc *e_local;
  LexState *ls_local;
  
  bl._8_8_ = ls->fs;
  lVar3 = (long)((FuncState *)bl._8_8_)->bcbase - (long)ls->bcstack >> 3;
  fs.uvtmp._116_4_ = line;
  fs._732_4_ = needself;
  fs_init(ls,(FuncState *)&pfs);
  fscope_begin((FuncState *)&pfs,(FuncScope *)&pt,0);
  fs.nkn._0_2_ = fs.uvtmp[0x3a];
  fs.nkn._2_2_ = fs.uvtmp[0x3b];
  BVar1 = parse_params(ls,fs._732_4_);
  fs.bclim._1_1_ = (undefined1)BVar1;
  fs._64_8_ = *(long *)(bl._8_8_ + 0x48) + (ulong)*(uint *)(bl._8_8_ + 0x28) * 8;
  fs.bcbase._0_4_ = *(int *)(bl._8_8_ + 0x50) - *(int *)(bl._8_8_ + 0x28);
  bcemit_INS((FuncState *)&pfs,0x59);
  parse_chunk(ls);
  if (ls->tok != 0x106) {
    lex_match(ls,0x106,0x109,fs.uvtmp._116_4_);
  }
  ls->lastline = ls->linenumber;
  gc = (GCobj *)fs_finish(ls,ls->linenumber);
  fs_00 = bl._8_8_;
  *(BCInsLine **)(bl._8_8_ + 0x48) = ls->bcstack + lVar3;
  *(MSize *)(bl._8_8_ + 0x50) = ls->sizebcstack - (int)lVar3;
  BVar1 = const_gc((FuncState *)bl._8_8_,gc,0xfffffff8);
  BVar2 = bcemit_INS((FuncState *)fs_00,BVar1 << 0x10 | 0x33);
  e->k = VRELOCABLE;
  (e->u).s.info = BVar2;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  *(byte *)(bl._8_8_ + 0x58) = *(byte *)(bl._8_8_ + 0x58) | (byte)fs.bclim & 4;
  if ((*(byte *)(bl._8_8_ + 0x58) & 1) == 0) {
    if ((*(byte *)(bl._8_8_ + 0x58) & 0x20) != 0) {
      *(byte *)(bl._8_8_ + 0x58) = *(byte *)(bl._8_8_ + 0x58) | 0x40;
    }
    *(byte *)(bl._8_8_ + 0x58) = *(byte *)(bl._8_8_ + 0x58) | 1;
  }
  lj_lex_next(ls);
  return;
}

Assistant:

static void parse_body(LexState *ls, ExpDesc *e, int needself, BCLine line)
{
  FuncState fs, *pfs = ls->fs;
  FuncScope bl;
  GCproto *pt;
  ptrdiff_t oldbase = pfs->bcbase - ls->bcstack;
  fs_init(ls, &fs);
  fscope_begin(&fs, &bl, 0);
  fs.linedefined = line;
  fs.numparams = (uint8_t)parse_params(ls, needself);
  fs.bcbase = pfs->bcbase + pfs->pc;
  fs.bclim = pfs->bclim - pfs->pc;
  bcemit_AD(&fs, BC_FUNCF, 0, 0);  /* Placeholder. */
  parse_chunk(ls);
  if (ls->tok != TK_end) lex_match(ls, TK_end, TK_function, line);
  pt = fs_finish(ls, (ls->lastline = ls->linenumber));
  pfs->bcbase = ls->bcstack + oldbase;  /* May have been reallocated. */
  pfs->bclim = (BCPos)(ls->sizebcstack - oldbase);
  /* Store new prototype in the constant array of the parent. */
  expr_init(e, VRELOCABLE,
	    bcemit_AD(pfs, BC_FNEW, 0, const_gc(pfs, obj2gco(pt), LJ_TPROTO)));
#if LJ_HASFFI
  pfs->flags |= (fs.flags & PROTO_FFI);
#endif
  if (!(pfs->flags & PROTO_CHILD)) {
    if (pfs->flags & PROTO_HAS_RETURN)
      pfs->flags |= PROTO_FIXUP_RETURN;
    pfs->flags |= PROTO_CHILD;
  }
  lj_lex_next(ls);
}